

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::Parser::SkipStatement(Parser *this)

{
  bool bVar1;
  Parser *in_RDI;
  Tokenizer *in_stack_000000b8;
  char *in_stack_000000c0;
  Parser *in_stack_000000c8;
  undefined4 in_stack_ffffffffffffffe8;
  TokenType in_stack_ffffffffffffffec;
  Parser *this_00;
  
  this_00 = in_RDI;
  do {
    bVar1 = AtEnd((Parser *)0x607e0d);
    if (bVar1) {
      return;
    }
    bVar1 = LookingAtType(in_RDI,in_stack_ffffffffffffffec);
    if (bVar1) {
      bVar1 = TryConsumeEndOfDeclaration
                        (in_stack_000000c8,in_stack_000000c0,(LocationRecorder *)in_stack_000000b8);
      if (bVar1) {
        return;
      }
      bVar1 = TryConsume(this_00,(char *)in_RDI);
      if (bVar1) {
        SkipRestOfBlock(in_RDI);
        return;
      }
      bVar1 = LookingAt(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
                       );
      if (bVar1) {
        return;
      }
    }
    io::Tokenizer::Next(in_stack_000000b8);
  } while( true );
}

Assistant:

void Parser::SkipStatement() {
  while (true) {
    if (AtEnd()) {
      return;
    } else if (LookingAtType(io::Tokenizer::TYPE_SYMBOL)) {
      if (TryConsumeEndOfDeclaration(";", NULL)) {
        return;
      } else if (TryConsume("{")) {
        SkipRestOfBlock();
        return;
      } else if (LookingAt("}")) {
        return;
      }
    }
    input_->Next();
  }
}